

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nurbs.h
# Opt level: O0

Index anurbs::Nurbs::
      upper_bound<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                (Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>
                 *values,Index first,Index last,double value)

{
  long lVar1;
  CoeffReturnType CVar2;
  Index step;
  Index i;
  Index count;
  double value_local;
  Index last_local;
  Index first_local;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> *values_local;
  
  lVar1 = last - first;
  last_local = first;
  while (i = lVar1, 0 < i) {
    lVar1 = i / 2;
    CVar2 = Eigen::
            DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
            ::operator[]((DenseCoeffsBase<Eigen::Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_>,_0>
                          *)values,lVar1 + last_local);
    if (CVar2 <= value) {
      last_local = lVar1 + last_local + 1;
      lVar1 = i - (lVar1 + 1);
    }
  }
  return last_local;
}

Assistant:

static Index upper_bound(TKnots values, Index first, Index last, double value)
    {
        auto count = last - first;
        Index i, step;
    
        while (count > 0) {
            i = first; 
            step = count / 2; 
            i += step;
            if (!(value < values[i])) {
                first = ++i;
                count -= step + 1;
            } else {
                count = step;
            }
        }
        return first;
    }